

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecNum::setTo
          (DecNum *this,uint8_t *bcd,int32_t length,int32_t scale,bool isNegative,UErrorCode *status
          )

{
  decNumber *dn;
  int32_t iVar1;
  UErrorCode UVar2;
  
  if (length < 0x23) {
    iVar1 = 0x22;
  }
  else {
    MaybeStackHeaderAndArray<decNumber,_char,_34>::resize(&this->fData,length,0);
    iVar1 = length;
  }
  (this->fContext).digits = iVar1;
  UVar2 = U_UNSUPPORTED_ERROR;
  if ((0xc4653600 < length + 0xc4653600U) &&
     (-0x3b9ac9fe - length <= scale && scale <= 1000000000 - length)) {
    dn = (this->fData).ptr;
    dn->digits = length;
    dn->exponent = scale;
    dn->bits = isNegative << 7;
    uprv_decNumberSetBCD_63(dn,bcd,length);
    if ((this->fContext).status == 0) {
      return;
    }
    UVar2 = U_INTERNAL_PROGRAM_ERROR;
  }
  *status = UVar2;
  return;
}

Assistant:

void
DecNum::setTo(const uint8_t* bcd, int32_t length, int32_t scale, bool isNegative, UErrorCode& status) {
    if (length > kDefaultDigits) {
        fData.resize(length, 0);
        fContext.digits = length;
    } else {
        fContext.digits = kDefaultDigits;
    }

    // "digits is of type int32_t, and must have a value in the range 1 through 999,999,999."
    if (length < 1 || length > 999999999) {
        // Too large for decNumber
        status = U_UNSUPPORTED_ERROR;
        return;
    }
    // "The exponent field holds the exponent of the number. Its range is limited by the requirement that
    // "the range of the adjusted exponent of the number be balanced and fit within a whole number of
    // "decimal digits (in this implementation, be –999,999,999 through +999,999,999). The adjusted
    // "exponent is the exponent that would result if the number were expressed with a single digit before
    // "the decimal point, and is therefore given by exponent+digits-1."
    if (scale > 999999999 - length + 1 || scale < -999999999 - length + 1) {
        // Too large for decNumber
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    fData.getAlias()->digits = length;
    fData.getAlias()->exponent = scale;
    fData.getAlias()->bits = static_cast<uint8_t>(isNegative ? DECNEG : 0);
    uprv_decNumberSetBCD(fData, bcd, static_cast<uint32_t>(length));
    if (fContext.status != 0) {
        // Some error occurred while constructing the decNumber.
        status = U_INTERNAL_PROGRAM_ERROR;
    }
}